

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorShower::rgbEd(QColorShower *this)

{
  QLineEdit *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_58;
  QColor local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->rgbOriginal = true;
  uVar1 = QSpinBox::value(&this->rEd->super_QSpinBox);
  uVar2 = QSpinBox::value(&this->gEd->super_QSpinBox);
  uVar3 = QSpinBox::value(&this->bEd->super_QSpinBox);
  iVar4 = currentAlpha(this);
  uVar1 = uVar3 & 0xff | (uVar2 & 0xff) << 8 | (uVar1 & 0xff) << 0x10 | iVar4 << 0x18;
  this->curCol = uVar1;
  rgb2hsv(uVar1,&this->hue,&this->sat,&this->val);
  QColSpinBox::setValue(this->hEd,this->hue);
  QColSpinBox::setValue(this->sEd,this->sat);
  QColSpinBox::setValue(this->vEd,this->val);
  this_00 = this->htEd;
  QColor::QColor(&local_40,this->curCol);
  QColor::name((NameFormat)&QStack_58);
  QLineEdit::setText(this_00,(QString *)&QStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
  showCurrentColor(this);
  newCol(this,this->curCol);
  updateQColor(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::rgbEd()
{
    rgbOriginal = true;
    curCol = qRgba(rEd->value(), gEd->value(), bEd->value(), currentAlpha());

    rgb2hsv(currentColor(), hue, sat, val);

    hEd->setValue(hue);
    sEd->setValue(sat);
    vEd->setValue(val);

    htEd->setText(QColor(curCol).name());

    showCurrentColor();
    emit newCol(currentColor());
    updateQColor();
}